

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  _func_void_j_decompress_ptr **pp_Var1;
  uint uVar2;
  jpeg_d_coef_controller *pjVar3;
  jpeg_component_info *pjVar4;
  inverse_DCT_method_ptr p_Var5;
  int iVar6;
  boolean bVar7;
  int iVar8;
  JSAMPARRAY ppJVar9;
  uint uVar10;
  long lVar11;
  JDIMENSION JVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  
  pjVar3 = cinfo->coef;
  uVar13 = cinfo->total_iMCU_rows;
  iVar14 = *(int *)((long)&pjVar3[1].start_input_pass + 4);
  iVar6 = *(int *)&pjVar3[1].consume_data;
  if (iVar14 < iVar6) {
    uVar10 = cinfo->MCUs_per_row - 1;
    pp_Var1 = &pjVar3[1].start_output_pass;
    uVar20 = *(uint *)&pjVar3[1].start_input_pass;
    do {
      if (uVar20 <= uVar10) {
        do {
          if (cinfo->lim_Se != 0) {
            memset(*pp_Var1,0,(long)cinfo->blocks_in_MCU << 7);
          }
          bVar7 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)pp_Var1);
          if (bVar7 == 0) {
            *(int *)((long)&pjVar3[1].start_input_pass + 4) = iVar14;
            *(uint *)&pjVar3[1].start_input_pass = uVar20;
            return 0;
          }
          iVar6 = cinfo->comps_in_scan;
          if (0 < iVar6) {
            lVar11 = 0;
            iVar15 = 0;
            do {
              pjVar4 = cinfo->cur_comp_info[lVar11];
              if (pjVar4->component_needed == 0) {
                iVar15 = iVar15 + pjVar4->MCU_blocks;
              }
              else {
                iVar8 = pjVar4->MCU_height;
                if (0 < iVar8) {
                  p_Var5 = cinfo->idct->inverse_DCT[pjVar4->component_index];
                  iVar6 = pjVar4->MCU_sample_width;
                  uVar2 = (&pjVar4->MCU_width)[(ulong)(uVar10 <= uVar20) * 4];
                  iVar17 = pjVar4->DCT_v_scaled_size;
                  ppJVar9 = output_buf[pjVar4->component_index] + iVar17 * iVar14;
                  uVar18 = 1;
                  if (1 < (int)uVar2) {
                    uVar18 = (ulong)uVar2;
                  }
                  iVar16 = 0;
                  do {
                    if (((cinfo->input_iMCU_row < uVar13 - 1) ||
                        (iVar14 + iVar16 < pjVar4->last_row_height)) && (0 < (int)uVar2)) {
                      uVar19 = 0;
                      JVar12 = iVar6 * uVar20;
                      do {
                        (*p_Var5)(cinfo,pjVar4,(JCOEFPTR)pp_Var1[(long)iVar15 + uVar19],ppJVar9,
                                  JVar12);
                        JVar12 = JVar12 + pjVar4->DCT_h_scaled_size;
                        uVar19 = uVar19 + 1;
                      } while (uVar18 != uVar19);
                      iVar17 = pjVar4->DCT_v_scaled_size;
                      iVar8 = pjVar4->MCU_height;
                    }
                    iVar15 = iVar15 + pjVar4->MCU_width;
                    ppJVar9 = ppJVar9 + iVar17;
                    iVar16 = iVar16 + 1;
                  } while (iVar16 < iVar8);
                  iVar6 = cinfo->comps_in_scan;
                }
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < iVar6);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 <= uVar10);
        iVar6 = *(int *)&pjVar3[1].consume_data;
      }
      *(undefined4 *)&pjVar3[1].start_input_pass = 0;
      iVar14 = iVar14 + 1;
      uVar20 = 0;
    } while (iVar14 < iVar6);
    uVar13 = cinfo->total_iMCU_rows;
  }
  cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
  uVar20 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar20;
  if (uVar20 < uVar13) {
    start_iMCU_row(cinfo);
    iVar14 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar14 = 4;
  }
  return iVar14;
}

Assistant:

METHODDEF(int)
decompress_onepass (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      if (cinfo->lim_Se)	/* can bypass in DC only case */
	FMEMZERO((void FAR *) coef->MCU_buffer[0],
		 (size_t) (cinfo->blocks_in_MCU * SIZEOF(JBLOCK)));
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
      /* Determine where data should go in output_buf and do the IDCT thing.
       * We skip dummy blocks at the right and bottom edges (but blkn gets
       * incremented past them!).  Note the inner loop relies on having
       * allocated the MCU_buffer[] blocks sequentially.
       */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	/* Don't bother to IDCT an uninteresting component. */
	if (! compptr->component_needed) {
	  blkn += compptr->MCU_blocks;
	  continue;
	}
	inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
	useful_width = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						    : compptr->last_col_width;
	output_ptr = output_buf[compptr->component_index] +
	  yoffset * compptr->DCT_v_scaled_size;
	start_col = MCU_col_num * compptr->MCU_sample_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (cinfo->input_iMCU_row < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    output_col = start_col;
	    for (xindex = 0; xindex < useful_width; xindex++) {
	      (*inverse_DCT) (cinfo, compptr,
			      (JCOEFPTR) coef->MCU_buffer[blkn+xindex],
			      output_ptr, output_col);
	      output_col += compptr->DCT_h_scaled_size;
	    }
	  }
	  blkn += compptr->MCU_width;
	  output_ptr += compptr->DCT_v_scaled_size;
	}
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}